

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_importedGrandchildUnitsNotCompatible_Test::TestBody
          (Units_importedGrandchildUnitsNotCompatible_Test *this)

{
  byte bVar1;
  char *local_c0 [4];
  AssertHelper local_a0 [8];
  Message local_98 [8];
  ModelPtr model;
  UnitsPtr u3;
  UnitsPtr u2;
  UnitsPtr u1;
  UnitsPtr imported_units;
  UnitsPtr u0;
  ImportSourcePtr imp;
  AssertionResult gtest_ar_;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"nurseryrhymes",(allocator<char> *)&imported_units);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"imported_units",(allocator<char> *)&imp);
  libcellml::Units::create((string *)&imported_units);
  std::__cxx11::string::~string((string *)local_c0);
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"i_am_a_url",(allocator<char> *)&u0);
  libcellml::ImportSource::setUrl
            ((string *)
             imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_c0);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (imported_units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             + 0x10));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"u0",(allocator<char> *)&u1)
  ;
  libcellml::Units::create((string *)&u0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"imported_units",(allocator<char> *)&u1);
  libcellml::Units::addUnit
            ((string *)u0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"u1",(allocator<char> *)&u2)
  ;
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"u0",(allocator<char> *)&u2)
  ;
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"u2",(allocator<char> *)&u3)
  ;
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"u1",(allocator<char> *)&u3)
  ;
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"u3",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&u3);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"imported_units",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((string *)u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_c0);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Units::compatible((shared_ptr *)&u2,(shared_ptr *)&u3);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,&gtest_ar_.success_,
               "libcellml::Units::compatible(u2, u3)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x992,local_c0[0]);
    testing::internal::AssertHelper::operator=(local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    std::__cxx11::string::~string((string *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imported_units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, importedGrandchildUnitsNotCompatible)
{
    auto model = libcellml::Model::create("nurseryrhymes");

    auto imported_units = libcellml::Units::create("imported_units");
    auto imp = libcellml::ImportSource::create();
    imp->setUrl("i_am_a_url");
    imported_units->setImportSource(imp);

    auto u0 = libcellml::Units::create("u0");
    u0->addUnit("imported_units");

    auto u1 = libcellml::Units::create("u1");
    u1->addUnit("u0");

    auto u2 = libcellml::Units::create("u2");
    u2->addUnit("u1");

    auto u3 = libcellml::Units::create("u3");
    u3->addUnit("imported_units");

    model->addUnits(u0);
    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(imported_units);

    // Expect false only because the first units "imported_units" is imported... otherwise it would be true.
    // Imports are not resolved during the compatibility/equivalence checking, so any comparisons which
    // have unresolved imports must return `false` as there's not enough information to confirm that they're
    // the same.
    EXPECT_FALSE(libcellml::Units::compatible(u2, u3));
}